

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

int __thiscall
vkt::sr::anon_unknown_0::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  TextureType_conflict textureType;
  WrapMode wrapS;
  WrapMode wrapT;
  FilterMode minFilter;
  FilterMode magFilter;
  TestContext *pTVar1;
  uint uVar2;
  TestNode *node;
  undefined8 extraout_RAX;
  TestNode *pTVar3;
  long lVar4;
  TestNode *pTVar5;
  undefined8 extraout_RAX_00;
  TestNode *pTVar6;
  TestNode *pTVar7;
  long *plVar8;
  undefined8 uVar9;
  OffsetSize OVar10;
  char *description;
  size_type *psVar11;
  string *psVar12;
  IVec3 *pIVar13;
  ulong *puVar14;
  GatherType GVar15;
  GatherType GVar16;
  char *pcVar17;
  anon_struct_24_2_3f8e1b6f *paVar18;
  long lVar19;
  long lVar20;
  WrapMode *pWVar21;
  ulong uVar22;
  TextureFormat textureFormat;
  bool bVar23;
  ulong uVar24;
  CompareMode shadowCompareMode;
  long lVar25;
  TextureSwizzleComponent comp;
  int baseLevel;
  bool bVar26;
  bool bVar27;
  string *local_348;
  long local_340;
  undefined1 local_338 [24];
  string caseName_1;
  MaybeTextureSwizzle swizzle;
  string local_2c0;
  anon_struct_16_2_3ce319a5 *local_2a0;
  TestNode *local_298;
  IVec3 *local_290;
  TestNode *local_288;
  undefined4 local_280;
  uint local_27c;
  TestNode *local_278;
  ulong local_270;
  MaybeTextureSwizzle swizzle_1;
  string caseName;
  ios_base local_1b0 [264];
  anon_struct_16_2_3ce319a5 formats [4];
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  
  formats[0].name = "rgba8";
  formats[0].format.order = RGBA;
  formats[0].format.type = UNORM_INT8;
  formats[1].name = "rgba8ui";
  formats[1].format.order = RGBA;
  formats[1].format.type = UNSIGNED_INT8;
  formats[2].name = "rgba8i";
  formats[2].format.order = RGBA;
  formats[2].format.type = SIGNED_INT8;
  formats[3].name = "depth32f";
  formats[3].format.order = D;
  formats[3].format.type = FLOAT;
  textureSizes[0].name = "size_pot";
  textureSizes[0].size.m_data[0] = 0x40;
  textureSizes[0].size.m_data[1] = 0x40;
  textureSizes[0].size.m_data[2] = 3;
  textureSizes[1].name = "size_npot";
  textureSizes[1].size.m_data[0] = 0x11;
  textureSizes[1].size.m_data[1] = 0x17;
  textureSizes[1].size.m_data[2] = 3;
  GVar16 = GATHERTYPE_BASIC;
  do {
    node = (TestNode *)operator_new(0x70);
    local_338._16_4_ = GVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               &DAT_00af9478 + *(int *)(&DAT_00af9478 + (ulong)GVar16 * 4),
               &DAT_00af9488 + *(int *)(&DAT_00af9488 + (ulong)GVar16 * 4));
    tcu::TestNode::addChild((TestNode *)this,node);
    OVar10 = OFFSETSIZE_NONE;
    uVar9 = extraout_RAX;
    GVar16 = local_338._16_4_;
    do {
      uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),GVar16 != GATHERTYPE_BASIC);
      local_338._20_4_ = OVar10;
      if ((GVar16 != GATHERTYPE_BASIC) != (OVar10 == OFFSETSIZE_NONE)) {
        if (OVar10 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM &&
            (GVar16 ^ GATHERTYPE_OFFSETS) == GATHERTYPE_BASIC) {
          return GVar16 ^ GATHERTYPE_OFFSETS;
        }
        local_278 = node;
        if (OVar10 != OFFSETSIZE_NONE) {
          pTVar3 = (TestNode *)operator_new(0x70);
          pcVar17 = (char *)0x0;
          if (OVar10 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
            pcVar17 = "implementation_offset";
          }
          description = (char *)0x0;
          if (OVar10 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
            description = "Use offsets within the implementation range";
          }
          if (OVar10 == OFFSETSIZE_MINIMUM_REQUIRED) {
            pcVar17 = "min_required_offset";
            description = "Use offsets within Vulkan minimum required range";
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                     pcVar17,description);
          GVar16 = local_338._16_4_;
          local_278 = pTVar3;
          if (pTVar3 != node) {
            tcu::TestNode::addChild(node,pTVar3);
            GVar16 = local_338._16_4_;
          }
        }
        bVar26 = local_338._20_4_ != OFFSETSIZE_MINIMUM_REQUIRED;
        lVar4 = 0;
        GVar15 = GVar16;
        do {
          textureType = (&DAT_00cf7f58)[lVar4 * 4];
          if ((GVar15 == GATHERTYPE_BASIC) || (textureType != TEXTURETYPE_CUBE)) {
            pTVar3 = (TestNode *)operator_new(0x70);
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                       *(char **)(&DAT_00cf7f50 + lVar4 * 0x10),"");
            tcu::TestNode::addChild(local_278,pTVar3);
            lVar20 = 0;
            do {
              pTVar5 = (TestNode *)operator_new(0x70);
              pcVar17 = "";
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar5,
                         (this->super_TestCaseGroup).super_TestNode.m_testCtx,formats[lVar20].name,
                         "");
              local_2a0 = formats + lVar20;
              local_298 = pTVar5;
              tcu::TestNode::addChild(pTVar3,pTVar5);
              uVar9 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
              bVar27 = false;
              do {
                local_280 = (undefined4)uVar9;
                pTVar5 = local_298;
                if (bVar27) {
                  pTVar5 = (TestNode *)operator_new(0x70);
                  pcVar17 = "Test case variants that don\'t sample around cube map corners";
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar5,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                  if (local_298 != pTVar5) {
                    tcu::TestNode::addChild(local_298,pTVar5);
                  }
                }
                local_270 = (ulong)bVar27;
                pcVar17 = (char *)CONCAT71((int7)((ulong)pcVar17 >> 8),1);
                paVar18 = textureSizes;
                do {
                  local_27c = (uint)pcVar17;
                  pTVar6 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar6,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,paVar18->name,"");
                  local_290 = &paVar18->size;
                  tcu::TestNode::addChild(pTVar5,pTVar6);
                  textureFormat.type = SNORM_INT8;
                  textureFormat.order = (local_2a0->format).order;
                  shadowCompareMode = COMPAREMODE_NONE;
                  do {
                    if (((textureFormat.order - D & 0xfffffffd) == 0) ==
                        (shadowCompareMode != COMPAREMODE_NONE)) {
                      pTVar7 = pTVar6;
                      if (shadowCompareMode != COMPAREMODE_NONE) {
                        if ((shadowCompareMode != COMPAREMODE_GREATER) &&
                           (shadowCompareMode != COMPAREMODE_LESS)) goto LAB_0061557c;
                        pTVar7 = (TestNode *)operator_new(0x70);
                        pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        local_340 = 0;
                        local_338._0_8_ = local_338._0_8_ & 0xffffffffffffff00;
                        local_348 = (string *)local_338;
                        plVar8 = (long *)std::__cxx11::string::append((char *)&local_348);
                        caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                        psVar11 = (size_type *)(plVar8 + 2);
                        if ((size_type *)*plVar8 == psVar11) {
                          caseName_1.field_2._M_allocated_capacity = *psVar11;
                          caseName_1.field_2._8_8_ = plVar8[3];
                        }
                        else {
                          caseName_1.field_2._M_allocated_capacity = *psVar11;
                          caseName_1._M_dataplus._M_p = (pointer)*plVar8;
                        }
                        caseName_1._M_string_length = plVar8[1];
                        *plVar8 = (long)psVar11;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        plVar8 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                        psVar11 = (size_type *)(plVar8 + 2);
                        if ((size_type *)*plVar8 == psVar11) {
                          caseName.field_2._M_allocated_capacity = *psVar11;
                          caseName.field_2._8_8_ = plVar8[3];
                        }
                        else {
                          caseName.field_2._M_allocated_capacity = *psVar11;
                          caseName._M_dataplus._M_p = (pointer)*plVar8;
                        }
                        caseName._M_string_length = plVar8[1];
                        *plVar8 = (long)psVar11;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        tcu::TestCaseGroup::TestCaseGroup
                                  ((TestCaseGroup *)pTVar7,pTVar1,caseName._M_dataplus._M_p,"");
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName._M_dataplus._M_p != &caseName.field_2) {
                          operator_delete(caseName._M_dataplus._M_p,
                                          caseName.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if (local_348 != (string *)local_338) {
                          operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                        }
                        if (pTVar7 != pTVar6) {
                          tcu::TestNode::addChild(pTVar6,pTVar7);
                        }
                      }
                      lVar25 = 1;
                      pWVar21 = &DAT_00cf7f88;
                      local_288 = pTVar7;
                      do {
                        wrapS = *pWVar21;
                        lVar19 = 0;
                        if (lVar25 != 3) {
                          lVar19 = lVar25;
                        }
                        wrapT = (&DAT_00cf7f88)[lVar19 * 4];
                        swizzle.m_swizzle.m_data._0_8_ = &swizzle.m_isSome;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_R;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_R;
                        stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
                        plVar8 = (long *)std::__cxx11::string::append((char *)&swizzle);
                        pIVar13 = local_290;
                        local_348 = (string *)local_338;
                        psVar12 = (string *)(plVar8 + 2);
                        if ((string *)*plVar8 == psVar12) {
                          local_338._0_8_ = (psVar12->_M_dataplus)._M_p;
                          local_338._8_8_ = plVar8[3];
                        }
                        else {
                          local_338._0_8_ = (psVar12->_M_dataplus)._M_p;
                          local_348 = (string *)*plVar8;
                        }
                        local_340 = plVar8[1];
                        *plVar8 = (long)psVar12;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        plVar8 = (long *)std::__cxx11::string::append((char *)&local_348);
                        caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                        psVar11 = (size_type *)(plVar8 + 2);
                        if ((size_type *)*plVar8 == psVar11) {
                          caseName_1.field_2._M_allocated_capacity = *psVar11;
                          caseName_1.field_2._8_8_ = plVar8[3];
                        }
                        else {
                          caseName_1.field_2._M_allocated_capacity = *psVar11;
                          caseName_1._M_dataplus._M_p = (pointer)*plVar8;
                        }
                        caseName_1._M_string_length = plVar8[1];
                        *plVar8 = (long)psVar11;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        plVar8 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                        psVar11 = (size_type *)(plVar8 + 2);
                        if ((size_type *)*plVar8 == psVar11) {
                          caseName.field_2._M_allocated_capacity = *psVar11;
                          caseName.field_2._8_8_ = plVar8[3];
                        }
                        else {
                          caseName.field_2._M_allocated_capacity = *psVar11;
                          caseName._M_dataplus._M_p = (pointer)*plVar8;
                        }
                        caseName._M_string_length = plVar8[1];
                        *plVar8 = (long)psVar11;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if (local_348 != (string *)local_338) {
                          operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                        }
                        if ((bool *)swizzle.m_swizzle.m_data._0_8_ != &swizzle.m_isSome) {
                          operator_delete((void *)swizzle.m_swizzle.m_data._0_8_,
                                          stack0xfffffffffffffd18 + 1);
                        }
                        pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&caseName_1,caseName._M_dataplus._M_p,
                                   (allocator<char> *)&local_2c0);
                        local_348 = (string *)local_338;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
                        textureFormat = local_2a0->format;
                        swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                        stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
                        pTVar7 = (TestNode *)
                                 makeTextureGatherCase
                                           (textureType,pTVar1,(string *)caseName_1._M_dataplus._M_p
                                            ,local_348,local_338._16_4_,local_338._20_4_,
                                            textureFormat,shadowCompareMode,wrapS,wrapT,&swizzle,
                                            NEAREST,NEAREST,0,pIVar13,(deUint32)local_270,
                                            IMAGE_BACKING_MODE_REGULAR);
                        tcu::TestNode::addChild(local_288,pTVar7);
                        if (local_348 != (string *)local_338) {
                          operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        std::operator+(&caseName_1,"sparse_",&caseName);
                        local_348 = (string *)local_338;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
                        swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                        stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
                        pTVar7 = (TestNode *)
                                 makeTextureGatherCase
                                           (textureType,pTVar1,(string *)caseName_1._M_dataplus._M_p
                                            ,local_348,local_338._16_4_,local_338._20_4_,
                                            textureFormat,shadowCompareMode,wrapS,wrapT,&swizzle,
                                            NEAREST,NEAREST,0,local_290,(deUint32)local_270,
                                            IMAGE_BACKING_MODE_SPARSE);
                        tcu::TestNode::addChild(local_288,pTVar7);
                        if (local_348 != (string *)local_338) {
                          operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName._M_dataplus._M_p != &caseName.field_2) {
                          operator_delete(caseName._M_dataplus._M_p,
                                          caseName.field_2._M_allocated_capacity + 1);
                        }
                        pWVar21 = pWVar21 + 4;
                        lVar25 = lVar25 + 1;
                      } while (lVar25 != 4);
                    }
LAB_0061557c:
                    shadowCompareMode = shadowCompareMode + COMPAREMODE_LESS;
                  } while (shadowCompareMode != COMPAREMODE_LAST);
                  paVar18 = textureSizes + 1;
                  pcVar17 = (char *)0x0;
                } while ((local_27c & 1) != 0);
                bVar27 = true;
                uVar9 = 0;
              } while (((byte)local_280 & textureType == TEXTURETYPE_CUBE) != 0);
              if (bVar26 || GVar16 == GATHERTYPE_OFFSETS) {
                if ((textureFormat.order != D) && (textureFormat.order != DS)) {
                  pTVar5 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar5,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,"texture_swizzle",
                             "");
                  tcu::TestNode::addChild(local_298,pTVar5);
                  uVar24 = 0;
                  do {
                    swizzle_1.m_swizzle.m_data[0] = FUNCTION_DRAW;
                    swizzle_1.m_swizzle.m_data[1] = FUNCTION_DRAW_INDEXED;
                    swizzle_1.m_swizzle.m_data[2] = FUNCTION_DRAW_INDIRECT;
                    swizzle_1.m_swizzle.m_data[3] = FUNCTION_DRAW_INDEXED_INDIRECT;
                    swizzle_1.m_isSome = true;
                    caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                    caseName_1._M_string_length = 0;
                    caseName_1.field_2._M_allocated_capacity =
                         caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    uVar22 = uVar24 & 0xffffffff;
                    lVar25 = 0;
                    do {
                      comp = (int)uVar22 + (int)(uVar22 / 6) * -6;
                      swizzle_1.m_swizzle.m_data[lVar25] = comp;
                      pcVar17 = "";
                      if (lVar25 != 0) {
                        pcVar17 = "_";
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                      anon_unknown_0::operator<<((ostream *)&caseName,comp);
                      std::__cxx11::stringbuf::str();
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                      std::ios_base::~ios_base(local_1b0);
                      de::toLower((string *)&swizzle,&local_2c0);
                      plVar8 = (long *)std::__cxx11::string::replace
                                                 ((ulong)&swizzle,0,(char *)0x0,(ulong)pcVar17);
                      local_348 = (string *)local_338;
                      psVar12 = (string *)(plVar8 + 2);
                      if ((string *)*plVar8 == psVar12) {
                        local_338._0_8_ = (psVar12->_M_dataplus)._M_p;
                        local_338._8_8_ = plVar8[3];
                      }
                      else {
                        local_338._0_8_ = (psVar12->_M_dataplus)._M_p;
                        local_348 = (string *)*plVar8;
                      }
                      local_340 = plVar8[1];
                      *plVar8 = (long)psVar12;
                      plVar8[1] = 0;
                      *(undefined1 *)(plVar8 + 2) = 0;
                      std::__cxx11::string::_M_append((char *)&caseName_1,(ulong)local_348);
                      if (local_348 != (string *)local_338) {
                        operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                      }
                      if ((bool *)swizzle.m_swizzle.m_data._0_8_ != &swizzle.m_isSome) {
                        operator_delete((void *)swizzle.m_swizzle.m_data._0_8_,
                                        stack0xfffffffffffffd18 + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                        operator_delete(local_2c0._M_dataplus._M_p,
                                        CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                                 local_2c0.field_2._M_local_buf[0]) + 1);
                      }
                      lVar25 = lVar25 + 1;
                      uVar22 = (ulong)((int)uVar22 + 1);
                    } while (lVar25 != 4);
                    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&caseName,caseName_1._M_dataplus._M_p,
                               (allocator<char> *)&local_2c0);
                    local_348 = (string *)local_338;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
                    textureFormat = local_2a0->format;
                    swizzle.m_swizzle.m_data[0] = 0x40;
                    swizzle.m_swizzle.m_data[1] = 0x40;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_A;
                    pTVar6 = (TestNode *)
                             makeTextureGatherCase
                                       (textureType,pTVar1,(string *)caseName._M_dataplus._M_p,
                                        local_348,local_338._16_4_,local_338._20_4_,textureFormat,
                                        COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,&swizzle_1,NEAREST,
                                        NEAREST,0,(IVec3 *)&swizzle,0,IMAGE_BACKING_MODE_REGULAR);
                    tcu::TestNode::addChild(pTVar5,pTVar6);
                    if (local_348 != (string *)local_338) {
                      operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName._M_dataplus._M_p != &caseName.field_2) {
                      operator_delete(caseName._M_dataplus._M_p,
                                      caseName.field_2._M_allocated_capacity + 1);
                    }
                    pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                    std::operator+(&caseName,"sparse_",&caseName_1);
                    local_348 = (string *)local_338;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
                    swizzle.m_swizzle.m_data[0] = 0x40;
                    swizzle.m_swizzle.m_data[1] = 0x40;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_A;
                    pTVar6 = (TestNode *)
                             makeTextureGatherCase
                                       (textureType,pTVar1,(string *)caseName._M_dataplus._M_p,
                                        local_348,local_338._16_4_,local_338._20_4_,textureFormat,
                                        COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,&swizzle_1,NEAREST,
                                        NEAREST,0,(IVec3 *)&swizzle,0,IMAGE_BACKING_MODE_SPARSE);
                    tcu::TestNode::addChild(pTVar5,pTVar6);
                    if (local_348 != (string *)local_338) {
                      operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName._M_dataplus._M_p != &caseName.field_2) {
                      operator_delete(caseName._M_dataplus._M_p,
                                      caseName.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                      operator_delete(caseName_1._M_dataplus._M_p,
                                      caseName_1.field_2._M_allocated_capacity + 1);
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != 6);
                }
                pTVar5 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar5,
                           (this->super_TestCaseGroup).super_TestNode.m_testCtx,"filter_mode",
                           "Test that filter modes have no effect");
                tcu::TestNode::addChild(local_298,pTVar5);
                uVar24 = (ulong)(local_2a0->format).type;
                pIVar13 = (IVec3 *)0x0;
                do {
                  local_288 = (TestNode *)(&DAT_00cf7fd0 + (long)pIVar13 * 2);
                  minFilter = (&DAT_00cf7fd8)[(long)pIVar13 * 4];
                  lVar25 = 0;
                  bVar27 = true;
                  local_290 = pIVar13;
                  do {
                    bVar23 = bVar27;
                    magFilter = (&DAT_00cf7fb8)[lVar25 * 4];
                    bVar27 = (textureFormat.order - D & 0xfffffffd) == 0;
                    uVar2 = (uint)uVar24;
                    if ((uVar2 < 7) && ((0x58U >> (uVar2 & 0x1f) & 1) != 0)) {
                      if (magFilter != NEAREST) {
LAB_00615ab3:
                        if ((uVar2 < 0x22) && ((0x2c0000000U >> (uVar24 & 0x3f) & 1) != 0)) {
                          if ((magFilter == NEAREST) && (minFilter == NEAREST_MIPMAP_NEAREST)) {
LAB_00615ae0:
                            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                            local_2c0._M_string_length = 0;
                            local_2c0.field_2._M_local_buf[0] = '\0';
                            plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
                            swizzle.m_swizzle.m_data._0_8_ = &swizzle.m_isSome;
                            puVar14 = (ulong *)(plVar8 + 2);
                            if ((ulong *)*plVar8 == puVar14) {
                              unique0x100015bd = *puVar14;
                            }
                            else {
                              unique0x00012000 = *puVar14;
                              swizzle.m_swizzle.m_data._0_8_ = (ulong *)*plVar8;
                            }
                            swizzle.m_swizzle.m_data._8_8_ = plVar8[1];
                            *plVar8 = (long)puVar14;
                            plVar8[1] = 0;
                            *(undefined1 *)(plVar8 + 2) = 0;
                            plVar8 = (long *)std::__cxx11::string::append((char *)&swizzle);
                            local_348 = (string *)local_338;
                            psVar12 = (string *)(plVar8 + 2);
                            if ((string *)*plVar8 == psVar12) {
                              local_338._0_8_ = (psVar12->_M_dataplus)._M_p;
                              local_338._8_8_ = plVar8[3];
                            }
                            else {
                              local_338._0_8_ = (psVar12->_M_dataplus)._M_p;
                              local_348 = (string *)*plVar8;
                            }
                            local_340 = plVar8[1];
                            *plVar8 = (long)psVar12;
                            plVar8[1] = 0;
                            *(undefined1 *)(plVar8 + 2) = 0;
                            plVar8 = (long *)std::__cxx11::string::append((char *)&local_348);
                            caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                            psVar11 = (size_type *)(plVar8 + 2);
                            if ((size_type *)*plVar8 == psVar11) {
                              caseName_1.field_2._M_allocated_capacity = *psVar11;
                              caseName_1.field_2._8_8_ = plVar8[3];
                            }
                            else {
                              caseName_1.field_2._M_allocated_capacity = *psVar11;
                              caseName_1._M_dataplus._M_p = (pointer)*plVar8;
                            }
                            caseName_1._M_string_length = plVar8[1];
                            *plVar8 = (long)psVar11;
                            plVar8[1] = 0;
                            *(undefined1 *)(plVar8 + 2) = 0;
                            plVar8 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                            caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                            psVar11 = (size_type *)(plVar8 + 2);
                            if ((size_type *)*plVar8 == psVar11) {
                              caseName.field_2._M_allocated_capacity = *psVar11;
                              caseName.field_2._8_8_ = plVar8[3];
                            }
                            else {
                              caseName.field_2._M_allocated_capacity = *psVar11;
                              caseName._M_dataplus._M_p = (pointer)*plVar8;
                            }
                            caseName._M_string_length = plVar8[1];
                            *plVar8 = (long)psVar11;
                            plVar8[1] = 0;
                            *(undefined1 *)(plVar8 + 2) = 0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            if (local_348 != (string *)local_338) {
                              operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                            }
                            if ((bool *)swizzle.m_swizzle.m_data._0_8_ != &swizzle.m_isSome) {
                              operator_delete((void *)swizzle.m_swizzle.m_data._0_8_,
                                              stack0xfffffffffffffd18 + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                              operator_delete(local_2c0._M_dataplus._M_p,
                                              CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_
                                                       ,local_2c0.field_2._M_local_buf[0]) + 1);
                            }
                            pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&caseName_1,caseName._M_dataplus._M_p,
                                       (allocator<char> *)&swizzle_1);
                            local_348 = (string *)local_338;
                            std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"")
                            ;
                            textureFormat = local_2a0->format;
                            swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                            stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
                            local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                            local_2c0._M_string_length =
                                 CONCAT44(local_2c0._M_string_length._4_4_,3);
                            pTVar6 = (TestNode *)
                                     makeTextureGatherCase
                                               (textureType,pTVar1,
                                                (string *)caseName_1._M_dataplus._M_p,local_348,
                                                local_338._16_4_,local_338._20_4_,textureFormat,
                                                (uint)bVar27,REPEAT_GL,REPEAT_GL,&swizzle,minFilter,
                                                magFilter,0,(IVec3 *)&local_2c0,0,
                                                IMAGE_BACKING_MODE_REGULAR);
                            tcu::TestNode::addChild(pTVar5,pTVar6);
                            if (local_348 != (string *)local_338) {
                              operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                            std::operator+(&caseName_1,"sparse_",&caseName);
                            local_348 = (string *)local_338;
                            std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"")
                            ;
                            swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                            stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
                            local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                            local_2c0._M_string_length =
                                 CONCAT44(local_2c0._M_string_length._4_4_,3);
                            pTVar6 = (TestNode *)
                                     makeTextureGatherCase
                                               (textureType,pTVar1,
                                                (string *)caseName_1._M_dataplus._M_p,local_348,
                                                local_338._16_4_,local_338._20_4_,textureFormat,
                                                (uint)bVar27,REPEAT_GL,REPEAT_GL,&swizzle,minFilter,
                                                magFilter,0,(IVec3 *)&local_2c0,0,
                                                IMAGE_BACKING_MODE_SPARSE);
                            tcu::TestNode::addChild(pTVar5,pTVar6);
                            if (local_348 != (string *)local_338) {
                              operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName._M_dataplus._M_p != &caseName.field_2) {
                              operator_delete(caseName._M_dataplus._M_p,
                                              caseName.field_2._M_allocated_capacity + 1);
                            }
                            uVar24 = (ulong)textureFormat >> 0x20;
                          }
                        }
                        else if ((2 < uVar2 - 0x1b) ||
                                (minFilter == NEAREST_MIPMAP_NEAREST && magFilter == NEAREST))
                        goto LAB_00615ae0;
                      }
                    }
                    else if (!bVar27 || magFilter != NEAREST) goto LAB_00615ab3;
                    lVar25 = 1;
                    bVar27 = false;
                  } while (bVar23);
                  pIVar13 = (IVec3 *)((long)local_290->m_data + 1);
                } while (pIVar13 != (IVec3 *)0x5);
                pTVar5 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar5,
                           (this->super_TestCaseGroup).super_TestNode.m_testCtx,"base_level","");
                tcu::TestNode::addChild(local_298,pTVar5);
                baseLevel = 1;
                do {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                  std::ostream::operator<<(&caseName,baseLevel);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                  std::ios_base::~ios_base(local_1b0);
                  plVar8 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_348,0,(char *)0x0,0xaf982d);
                  caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                  psVar11 = (size_type *)(plVar8 + 2);
                  if ((size_type *)*plVar8 == psVar11) {
                    caseName_1.field_2._M_allocated_capacity = *psVar11;
                    caseName_1.field_2._8_8_ = plVar8[3];
                  }
                  else {
                    caseName_1.field_2._M_allocated_capacity = *psVar11;
                    caseName_1._M_dataplus._M_p = (pointer)*plVar8;
                  }
                  caseName_1._M_string_length = plVar8[1];
                  *plVar8 = (long)psVar11;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  if (local_348 != (string *)local_338) {
                    operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                  }
                  bVar27 = (textureFormat.order - D & 0xfffffffd) == 0;
                  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&caseName,caseName_1._M_dataplus._M_p,
                             (allocator<char> *)&swizzle_1);
                  local_348 = (string *)local_338;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
                  textureFormat = local_2a0->format;
                  swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                  stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
                  local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                  local_2c0._M_string_length = CONCAT44(local_2c0._M_string_length._4_4_,3);
                  pTVar6 = (TestNode *)
                           makeTextureGatherCase
                                     (textureType,pTVar1,(string *)caseName._M_dataplus._M_p,
                                      local_348,local_338._16_4_,local_338._20_4_,textureFormat,
                                      (uint)bVar27,REPEAT_GL,REPEAT_GL,&swizzle,NEAREST,NEAREST,
                                      baseLevel,(IVec3 *)&local_2c0,0,IMAGE_BACKING_MODE_REGULAR);
                  tcu::TestNode::addChild(pTVar5,pTVar6);
                  if (local_348 != (string *)local_338) {
                    operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName._M_dataplus._M_p != &caseName.field_2) {
                    operator_delete(caseName._M_dataplus._M_p,
                                    caseName.field_2._M_allocated_capacity + 1);
                  }
                  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  std::operator+(&caseName,"sparse_",&caseName_1);
                  local_348 = (string *)local_338;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
                  swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                  stack0xfffffffffffffd18 = stack0xfffffffffffffd18 & 0xffffffffffffff00;
                  local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                  local_2c0._M_string_length = CONCAT44(local_2c0._M_string_length._4_4_,3);
                  pTVar6 = (TestNode *)
                           makeTextureGatherCase
                                     (textureType,pTVar1,(string *)caseName._M_dataplus._M_p,
                                      local_348,local_338._16_4_,local_338._20_4_,textureFormat,
                                      (uint)bVar27,REPEAT_GL,REPEAT_GL,&swizzle,NEAREST,NEAREST,
                                      baseLevel,(IVec3 *)&local_2c0,0,IMAGE_BACKING_MODE_SPARSE);
                  tcu::TestNode::addChild(pTVar5,pTVar6);
                  if (local_348 != (string *)local_338) {
                    operator_delete(local_348,(ulong)(local_338._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName._M_dataplus._M_p != &caseName.field_2) {
                    operator_delete(caseName._M_dataplus._M_p,
                                    caseName.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                    operator_delete(caseName_1._M_dataplus._M_p,
                                    caseName_1.field_2._M_allocated_capacity + 1);
                  }
                  baseLevel = baseLevel + 1;
                } while (baseLevel != 3);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != 4);
          }
          lVar4 = lVar4 + 1;
          GVar15 = local_338._16_4_;
        } while (lVar4 != 3);
        uVar9 = 3;
        GVar16 = local_338._16_4_;
      }
      OVar10 = local_338._20_4_ + OFFSETSIZE_MINIMUM_REQUIRED;
    } while (OVar10 != OFFSETSIZE_LAST);
    GVar16 = GVar16 + GATHERTYPE_OFFSET;
    if (GVar16 == GATHERTYPE_LAST) {
      return (int)uVar9;
    }
  } while( true );
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_testCtx, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			if (gatherType == GATHERTYPE_OFFSETS && offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) // \note offsets argument must be compile-time constant
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_testCtx,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within Vulkan minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);

			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_testCtx, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_testCtx, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_testCtx, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_testCtx, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_testCtx,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED || gatherType == GATHERTYPE_OFFSETS) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_testCtx, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_testCtx, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_testCtx, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}
					}
				}
			}
		}
	}
}